

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<SDL_Window_*> * __thiscall
testing::internal::MatcherBase<SDL_Window_*>::operator=
          (MatcherBase<SDL_Window_*> *this,MatcherBase<SDL_Window_*> *other)

{
  MatcherBase<SDL_Window_*> *other_local;
  MatcherBase<SDL_Window_*> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }